

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeglobals.cpp
# Opt level: O2

void __thiscall QMakeGlobals::QMakeGlobals(QMakeGlobals *this)

{
  (this->baseEnvs).d = (Data *)0x0;
  memset(&this->dir_sep,0,0x168);
  (this->source_root).d.d = (Data *)0x0;
  (this->source_root).d.ptr = (char16_t *)0x0;
  (this->source_root).d.size = 0;
  (this->build_root).d.d = (Data *)0x0;
  (this->build_root).d.ptr = (char16_t *)0x0;
  (this->build_root).d.size = 0;
  this->do_cache = true;
  this->debugLevel = 0;
  QString::operator=(&this->dirlist_sep,(QChar)0x3a);
  QString::operator=(&this->dir_sep,(QChar)0x2f);
  return;
}

Assistant:

QMakeGlobals::QMakeGlobals()
{
    do_cache = true;

#ifdef PROEVALUATOR_DEBUG
    debugLevel = 0;
#endif
#ifdef Q_OS_WIN
    dirlist_sep = QLatin1Char(';');
    dir_sep = QLatin1Char('\\');
#else
    dirlist_sep = QLatin1Char(':');
    dir_sep = QLatin1Char('/');
#endif
}